

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radix_partitioning.cpp
# Opt level: O1

void __thiscall
duckdb::RadixPartitionedColumnData::InitializeAppendStateInternal
          (RadixPartitionedColumnData *this,PartitionedColumnDataAppendState *state)

{
  vector<duckdb::unique_ptr<duckdb::ColumnDataAppendState,_std::default_delete<duckdb::ColumnDataAppendState>,_true>,_true>
  *this_00;
  undefined8 uVar1;
  const_reference this_01;
  pointer this_02;
  reference this_03;
  type state_00;
  size_type __n;
  size_type __n_00;
  undefined1 local_50 [16];
  ClientContext *local_40;
  pointer local_38;
  
  __n_00 = 1L << ((byte)this->radix_bits & 0x3f);
  this_00 = &state->partition_append_states;
  std::
  vector<duckdb::unique_ptr<duckdb::ColumnDataAppendState,_std::default_delete<duckdb::ColumnDataAppendState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnDataAppendState,_std::default_delete<duckdb::ColumnDataAppendState>,_true>_>_>
  ::reserve((vector<duckdb::unique_ptr<duckdb::ColumnDataAppendState,_std::default_delete<duckdb::ColumnDataAppendState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnDataAppendState,_std::default_delete<duckdb::ColumnDataAppendState>,_true>_>_>
             *)this_00,__n_00);
  local_38 = (pointer)&state->partition_buffers;
  local_50._8_8_ = state;
  std::
  vector<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
  ::reserve((vector<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
             *)local_38,__n_00);
  local_40 = (ClientContext *)&(this->super_PartitionedColumnData).partitions;
  __n = 0;
  do {
    local_50._0_8_ = operator_new(0x58);
    (((DataChunk *)local_50._0_8_)->data).
    super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
    super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (((DataChunk *)local_50._0_8_)->data).
    super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
    super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    *(undefined8 *)&((DataChunk *)local_50._0_8_)->capacity = 0;
    (((DataChunk *)local_50._0_8_)->vector_caches).
    super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
    super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (((DataChunk *)local_50._0_8_)->vector_caches).
    super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
    super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (((DataChunk *)local_50._0_8_)->vector_caches).
    super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
    super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ((__node_base *)
    &(((DataChunk *)local_50._0_8_)->data).
     super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
     super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
     super__Vector_impl_data._M_end_of_storage)->_M_nxt = (_Hash_node_base *)0x0;
    ((DataChunk *)local_50._0_8_)->count = 0;
    (((DataChunk *)(local_50._0_8_ + 0x40))->data).
    super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
    super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    ((__node_base *)
    &(((DataChunk *)(local_50._0_8_ + 0x40))->data).
     super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
     super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
     super__Vector_impl_data._M_finish)->_M_nxt = (_Hash_node_base *)0x0;
    (((DataChunk *)(local_50._0_8_ + 0x40))->data).
    super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
    super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (((DataChunk *)local_50._0_8_)->data).
    super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
    super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)&(((DataChunk *)local_50._0_8_)->vector_caches).
                   super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                   super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
    (((DataChunk *)local_50._0_8_)->data).
    super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
    super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)&DAT_00000001;
    ((_Prime_rehash_policy *)&((DataChunk *)local_50._0_8_)->capacity)->_M_max_load_factor = 1.0;
    (((DataChunk *)local_50._0_8_)->vector_caches).
    super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
    super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (((DataChunk *)local_50._0_8_)->vector_caches).
    super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
    super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    *(undefined1 *)
     &(((DataChunk *)local_50._0_8_)->vector_caches).
      super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
      super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = 0;
    ::std::
    vector<duckdb::unique_ptr<duckdb::ColumnDataAppendState,std::default_delete<duckdb::ColumnDataAppendState>,true>,std::allocator<duckdb::unique_ptr<duckdb::ColumnDataAppendState,std::default_delete<duckdb::ColumnDataAppendState>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::ColumnDataAppendState,std::default_delete<duckdb::ColumnDataAppendState>,true>>
              ((vector<duckdb::unique_ptr<duckdb::ColumnDataAppendState,std::default_delete<duckdb::ColumnDataAppendState>,true>,std::allocator<duckdb::unique_ptr<duckdb::ColumnDataAppendState,std::default_delete<duckdb::ColumnDataAppendState>,true>>>
                *)this_00,
               (unique_ptr<duckdb::ColumnDataAppendState,_std::default_delete<duckdb::ColumnDataAppendState>,_true>
                *)local_50);
    uVar1 = local_50._0_8_;
    if ((DataChunk *)local_50._0_8_ != (DataChunk *)0x0) {
      ::std::vector<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>::
      ~vector((vector<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_> *)
              (local_50._0_8_ + 0x40));
      ::std::
      _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::BufferHandle>,_std::allocator<std::pair<const_unsigned_long,_duckdb::BufferHandle>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::BufferHandle>,_std::allocator<std::pair<const_unsigned_long,_duckdb::BufferHandle>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     *)uVar1);
      operator_delete((void *)uVar1);
    }
    this_01 = vector<duckdb::unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>,_true>
              ::operator[]((vector<duckdb::unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>,_true>
                            *)local_40,__n);
    this_02 = unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
              ::operator->(this_01);
    this_03 = vector<duckdb::unique_ptr<duckdb::ColumnDataAppendState,_std::default_delete<duckdb::ColumnDataAppendState>,_true>,_true>
              ::operator[](this_00,__n);
    state_00 = unique_ptr<duckdb::ColumnDataAppendState,_std::default_delete<duckdb::ColumnDataAppendState>,_true>
               ::operator*(this_03);
    ColumnDataCollection::InitializeAppend(this_02,state_00);
    PartitionedColumnData::CreatePartitionBuffer((PartitionedColumnData *)local_50);
    ::std::
    vector<duckdb::unique_ptr<duckdb::DataChunk,std::default_delete<duckdb::DataChunk>,true>,std::allocator<duckdb::unique_ptr<duckdb::DataChunk,std::default_delete<duckdb::DataChunk>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::DataChunk,std::default_delete<duckdb::DataChunk>,true>>
              ((vector<duckdb::unique_ptr<duckdb::DataChunk,std::default_delete<duckdb::DataChunk>,true>,std::allocator<duckdb::unique_ptr<duckdb::DataChunk,std::default_delete<duckdb::DataChunk>,true>>>
                *)local_38,
               (unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true> *)
               local_50);
    uVar1 = local_50._0_8_;
    if ((DataChunk *)local_50._0_8_ != (DataChunk *)0x0) {
      DataChunk::~DataChunk((DataChunk *)local_50._0_8_);
      operator_delete((void *)uVar1);
    }
    __n = __n + 1;
  } while (__n_00 != __n);
  fixed_size_map_t<duckdb::list_entry_t>::resize
            ((fixed_size_map_t<duckdb::list_entry_t> *)(local_50._8_8_ + 0xb8),
             1L << ((byte)this->radix_bits & 0x3f));
  return;
}

Assistant:

void RadixPartitionedColumnData::InitializeAppendStateInternal(PartitionedColumnDataAppendState &state) const {
	const auto num_partitions = RadixPartitioning::NumberOfPartitions(radix_bits);
	state.partition_append_states.reserve(num_partitions);
	state.partition_buffers.reserve(num_partitions);
	for (idx_t i = 0; i < num_partitions; i++) {
		state.partition_append_states.emplace_back(make_uniq<ColumnDataAppendState>());
		partitions[i]->InitializeAppend(*state.partition_append_states[i]);
		state.partition_buffers.emplace_back(CreatePartitionBuffer());
	}

	// Initialize fixed-size map
	state.fixed_partition_entries.resize(RadixPartitioning::NumberOfPartitions(radix_bits));
}